

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O2

h__Writer * __thiscall
ASDCP::DCData::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,ui32_t HeaderSize,SubDescriptorList_t *subDescriptors)

{
  value_type *__x;
  DCDataDescriptor *this_00;
  long *in_R8;
  long *plVar1;
  h__WriterState local_98 [26];
  
  if (*(int *)&filename[0x1b].field_2 == 0) {
    Kumu::FileWriter::OpenWrite((string *)this);
    if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                      _vptr_TrackFileWriter) {
      *(int *)&filename[2]._M_string_length = (int)subDescriptors;
      this_00 = (DCDataDescriptor *)operator_new(0x170);
      MXF::DCDataDescriptor::DCDataDescriptor(this_00,(Dictionary *)filename->_M_string_length);
      *(DCDataDescriptor **)((long)&filename[0x18].field_2 + 8) = this_00;
      plVar1 = in_R8;
      while (plVar1 = (long *)*plVar1, plVar1 != in_R8) {
        __x = (value_type *)(plVar1 + 2);
        std::__cxx11::
        list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
        push_back((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                   *)(filename + 0x19),__x);
        Kumu::GenRandomValue(&(*__x)->InstanceUID);
        std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
                  ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                   (*(long *)((long)&filename[0x18].field_2 + 8) + 200),&(*__x)->InstanceUID);
      }
      MXF::h__WriterState::Goto_INIT(local_98);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_98);
      Kumu::Result_t::~Result_t((Result_t *)local_98);
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ui32_t HeaderSize,
                                    const SubDescriptorList_t& subDescriptors)
{
  if ( ! m_State.Test_BEGIN() )
    return RESULT_STATE;

  Result_t result = m_File.OpenWrite(filename);

  if ( ASDCP_SUCCESS(result) )
    {
      m_HeaderSize = HeaderSize;
      m_EssenceDescriptor = new MXF::DCDataDescriptor(m_Dict);
      SubDescriptorList_t::const_iterator sDObj;
      SubDescriptorList_t::const_iterator lastDescriptor = subDescriptors.end();
      for (sDObj = subDescriptors.begin(); sDObj != lastDescriptor; ++sDObj)
      {
          m_EssenceSubDescriptorList.push_back(*sDObj);
          GenRandomValue((*sDObj)->InstanceUID);
          m_EssenceDescriptor->SubDescriptors.push_back((*sDObj)->InstanceUID);
      }
      result = m_State.Goto_INIT();
    }

  return result;
}